

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_showref.cpp
# Opt level: O1

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::BindShowTable(Binder *this,ShowRef *ref)

{
  int iVar1;
  SubqueryRef *this_00;
  optional_ptr<duckdb::CommonTableExpressionInfo,_true> cte;
  long in_RDX;
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> select;
  templated_unique_single_t subquery;
  string sql;
  string lname;
  undefined1 local_a0 [8];
  _Head_base<0UL,_duckdb::SubqueryRef_*,_false> local_98;
  string local_90;
  _Alloc_hider local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string local_48;
  
  StringUtil::Lower(&local_48,(string *)(in_RDX + 0x68));
  local_68._8_8_ = 0;
  local_58._M_local_buf[0] = '\0';
  local_68._0_8_ = &local_58;
  iVar1 = ::std::__cxx11::string::compare((char *)&local_48);
  if (iVar1 == 0) {
    PragmaShowDatabases_abi_cxx11_();
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_48);
    if (iVar1 == 0) {
      PragmaShowTables_abi_cxx11_();
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_48);
      if (iVar1 == 0) {
        PragmaShowVariables_abi_cxx11_();
      }
      else {
        iVar1 = ::std::__cxx11::string::compare((char *)&local_48);
        if (iVar1 == 0) {
          PragmaShowTablesExpanded_abi_cxx11_();
        }
        else {
          PragmaShow(&local_90,(string *)(in_RDX + 0x68));
        }
      }
    }
  }
  ::std::__cxx11::string::operator=((string *)local_68,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  CreateViewInfo::ParseSelect((CreateViewInfo *)local_a0,(string *)local_68);
  this_00 = (SubqueryRef *)operator_new(0x70);
  local_70._M_p = (pointer)local_a0;
  local_a0 = (undefined1  [8])0x0;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  SubqueryRef::SubqueryRef
            (this_00,(unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                      *)&local_70,&local_90);
  local_98._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((_func_int **)local_70._M_p != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_70._M_p + 8))();
  }
  cte.ptr = (CommonTableExpressionInfo *)
            unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
            operator*((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                       *)&local_98);
  Bind(this,(SubqueryRef *)ref,cte);
  if (local_98._M_head_impl != (SubqueryRef *)0x0) {
    (*((local_98._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
  }
  if (local_a0 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_a0 + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._0_8_ != &local_58) {
    operator_delete((void *)local_68._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::BindShowTable(ShowRef &ref) {
	auto lname = StringUtil::Lower(ref.table_name);

	string sql;
	if (lname == "\"databases\"") {
		sql = PragmaShowDatabases();
	} else if (lname == "\"tables\"") {
		sql = PragmaShowTables();
	} else if (lname == "\"variables\"") {
		sql = PragmaShowVariables();
	} else if (lname == "__show_tables_expanded") {
		sql = PragmaShowTablesExpanded();
	} else {
		sql = PragmaShow(ref.table_name);
	}
	auto select = CreateViewInfo::ParseSelect(sql);
	auto subquery = make_uniq<SubqueryRef>(std::move(select));
	return Bind(*subquery);
}